

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

char * ucnv_io_nextStandardAliases
                 (UEnumeration *enumerator,int32_t *resultLength,UErrorCode *param_3)

{
  uint uVar1;
  uint *puVar2;
  uint16_t *puVar3;
  int32_t iVar4;
  ulong uVar6;
  uint16_t *puVar7;
  size_t sVar5;
  
  puVar7 = gMainTable.stringTable;
  puVar3 = gMainTable.taggedAliasLists;
  puVar2 = (uint *)enumerator->context;
  uVar6 = (ulong)*puVar2;
  if (uVar6 != 0) {
    uVar1 = puVar2[1];
    if (uVar1 < gMainTable.taggedAliasLists[uVar6]) {
      puVar2[1] = uVar1 + 1;
      puVar7 = puVar7 + puVar3[uVar6 + (ulong)uVar1 + 1];
      if (resultLength == (int32_t *)0x0) {
        return (char *)puVar7;
      }
      sVar5 = strlen((char *)puVar7);
      iVar4 = (int32_t)sVar5;
      goto LAB_0010e53b;
    }
  }
  iVar4 = 0;
  puVar7 = (uint16_t *)0x0;
  if (resultLength == (int32_t *)0x0) {
    return (char *)0x0;
  }
LAB_0010e53b:
  *resultLength = iVar4;
  return (char *)puVar7;
}

Assistant:

static const char * U_CALLCONV
ucnv_io_nextStandardAliases(UEnumeration *enumerator,
                            int32_t* resultLength,
                            UErrorCode * /*pErrorCode*/)
{
    UAliasContext *myContext = (UAliasContext *)(enumerator->context);
    uint32_t listOffset = myContext->listOffset;

    if (listOffset) {
        uint32_t listCount = gMainTable.taggedAliasLists[listOffset];
        const uint16_t *currList = gMainTable.taggedAliasLists + listOffset + 1;

        if (myContext->listIdx < listCount) {
            const char *myStr = GET_STRING(currList[myContext->listIdx++]);
            if (resultLength) {
                *resultLength = (int32_t)uprv_strlen(myStr);
            }
            return myStr;
        }
    }
    /* Either we accessed a zero length list, or we enumerated too far. */
    if (resultLength) {
        *resultLength = 0;
    }
    return NULL;
}